

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void cppurses::output::put(Glyph *g)

{
  byte bVar1;
  short sVar2;
  short fg;
  uint result;
  uint uVar3;
  long lVar4;
  uint uVar5;
  wchar_t symbol [2];
  cchar_t symbol_and_attributes;
  
  uVar3 = 0;
  fg = 0;
  sVar2 = 0;
  if ((g->brush).background_color_.initialized_ != false) {
    sVar2 = *(short *)(g->brush).background_color_.storage_.data_;
  }
  if ((g->brush).foreground_color_.initialized_ != false) {
    fg = *(short *)(g->brush).foreground_color_.storage_.data_;
  }
  sVar2 = Terminal::color_index((Terminal *)System::terminal,fg,sVar2);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    bVar1 = (&Attribute_list)[lVar4];
    if (((g->brush).attributes_.super__Base_bitset<1UL>._M_w >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
      uVar5 = 0;
      if (bVar1 < 8) {
        uVar5 = *(uint *)(&DAT_001674c4 + (ulong)bVar1 * 4);
      }
      uVar3 = uVar3 | uVar5;
    }
  }
  symbol[0] = g->symbol;
  symbol[1] = L'\0';
  symbol_and_attributes.chars[3] = L'\0';
  symbol_and_attributes.chars[4] = L'\0';
  symbol_and_attributes.ext_color = 0;
  symbol_and_attributes.attr = 0;
  symbol_and_attributes.chars[0] = L'\0';
  symbol_and_attributes.chars[1] = L'\0';
  symbol_and_attributes.chars[2] = L'\0';
  setcchar(&symbol_and_attributes,symbol,uVar3,(int)sVar2,0);
  wadd_wchnstr(_stdscr,&symbol_and_attributes,1);
  return;
}

Assistant:

void put(const Glyph& g) {
#ifdef SLOW_PAINT
    paint_indicator('X');
#endif
#ifdef add_wchstr
    put_as_wchar(g);
#else  // If no wchar_t support in ncurses.
    put_as_char(g);
#endif
#ifdef SLOW_PAINT
    refresh();
    std::this_thread::sleep_for(std::chrono::milliseconds(SLOW_PAINT));
#endif
}